

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

int INT_CMCondition_wait(CManager cm,int condition)

{
  CMControlList p_Var1;
  int iVar2;
  int iVar3;
  CMCondition p_Var4;
  CMControlList p_Var5;
  pthread_t pVar6;
  uint in_ESI;
  CManager in_RDI;
  int result;
  CMControlList cl;
  CMCondition cond;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar7;
  CMControlList in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  p_Var1 = in_RDI->control_list;
  iVar2 = CManager_locked(in_RDI);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_control.c"
                  ,0xd8,"int INT_CMCondition_wait(CManager, int)");
  }
  set_debug_flag((CManager)0x129df5);
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel Waiting for CMcondition %d\n",(ulong)in_ESI);
  }
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel locked cl\n");
  }
  p_Var4 = CMCondition_find(in_stack_ffffffffffffffc8,
                            CONCAT13(in_stack_ffffffffffffffc7,
                                     CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)))
  ;
  if (p_Var4 == (CMCondition)0x0) {
    return -1;
  }
  if (p_Var4->signaled != 0) {
    if (cm_control_debug_flag != 0) {
      fprintf((FILE *)in_RDI->CMTrace_file,"CMcondition %d already signalled\n",(ulong)in_ESI);
    }
    return 1;
  }
  if (p_Var4->failed != 0) {
    if (cm_control_debug_flag != 0) {
      fprintf((FILE *)in_RDI->CMTrace_file,"CMcondition %d already failed\n",(ulong)in_ESI);
    }
    return 0;
  }
  p_Var4->waiting = p_Var4->waiting + 1;
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel In condition wait, server thread = %p\n",
            p_Var1->server_thread);
  }
  if (p_Var1->has_thread == 0) {
    if (p_Var1->server_thread != 0) {
      in_stack_ffffffffffffffc8 = (CMControlList)p_Var1->server_thread;
      p_Var5 = (CMControlList)pthread_self();
      if (in_stack_ffffffffffffffc8 != p_Var5) {
        if (cm_control_debug_flag != 0) {
          fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel Waiting for CMcondition %d\n",
                  (ulong)in_ESI);
        }
        iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
        iVar3 = CManager_locked(in_RDI);
        if (iVar3 == 0) {
          __assert_fail("CManager_locked(cm)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_control.c"
                        ,0x10f,"int INT_CMCondition_wait(CManager, int)");
        }
        in_RDI->locked = in_RDI->locked + -1;
        pthread_cond_wait((pthread_cond_t *)&p_Var4->cond_condition,
                          (pthread_mutex_t *)&in_RDI->exchange_lock);
        in_RDI->locked = in_RDI->locked + 1;
        if (cm_control_debug_flag != 0) {
          fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel After wait for CMcondition %d\n",
                  (ulong)in_ESI);
        }
        goto LAB_0012a28c;
      }
    }
    p_Var1->cond_polling = 1;
    while( true ) {
      iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      uVar7 = true;
      if (p_Var4->signaled == 0) {
        uVar7 = p_Var4->failed != 0;
      }
      if (((uVar7 ^ 0xff) & 1) == 0) break;
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel  Polling for CMcondition %d\n",
                (ulong)in_ESI);
      }
      CMcontrol_list_wait((CMControlList)
                          CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffc6,
                                                  CONCAT24(in_stack_ffffffffffffffc4,
                                                           in_stack_ffffffffffffffc0))));
    }
    p_Var1->cond_polling = 0;
    if (cm_control_debug_flag != 0) {
      fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel  after Polling for CMcondition %d\n",
              (ulong)in_ESI);
    }
    p_Var1->server_thread = 0;
    if (cm_control_debug_flag != 0) {
      fprintf((FILE *)in_RDI->CMTrace_file,
              "CMLowLevel  In condition wait, reset server thread = %lx\n",p_Var1->server_thread);
    }
  }
  else {
    pVar6 = pthread_self();
    iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (pVar6 == p_Var1->server_thread) {
      p_Var1->cond_polling = 1;
      while( true ) {
        iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
        uVar7 = true;
        if (p_Var4->signaled == 0) {
          uVar7 = p_Var4->failed != 0;
        }
        if (((uVar7 ^ 0xff) & 1) == 0) break;
        if (cm_control_debug_flag != 0) {
          fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel polling for CMcondition %d\n",
                  (ulong)in_ESI);
        }
        CMcontrol_list_wait((CMControlList)
                            CONCAT17(in_stack_ffffffffffffffc7,
                                     CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffffc4,
                                                             in_stack_ffffffffffffffc0))));
        if (p_Var1->closed != 0) {
          p_Var4->failed = 1;
        }
      }
      p_Var1->cond_polling = 0;
    }
    else {
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel Waiting for CMcondition %d\n",(ulong)in_ESI
               );
      }
      iVar3 = CManager_locked(in_RDI);
      if (iVar3 == 0) {
        __assert_fail("CManager_locked(cm)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_control.c"
                      ,0x129,"int INT_CMCondition_wait(CManager, int)");
      }
      in_RDI->locked = in_RDI->locked + -1;
      pthread_cond_wait((pthread_cond_t *)&p_Var4->cond_condition,
                        (pthread_mutex_t *)&in_RDI->exchange_lock);
      in_RDI->locked = in_RDI->locked + 1;
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel After wait for CMcondition %d\n",
                (ulong)in_ESI);
      }
    }
  }
LAB_0012a28c:
  local_4 = p_Var4->signaled;
  CMCondition_destroy((CMControlList)CONCAT44(local_4,in_stack_ffffffffffffffd0),iVar2);
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)in_RDI->CMTrace_file,"CMLowLevel Return from wait CMcondition %d\n",
            (ulong)in_ESI);
  }
  return local_4;
}

Assistant:

extern int
INT_CMCondition_wait(CManager cm, int condition)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    int result;

    assert(CManager_locked(cm));
    set_debug_flag(cm);
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel Waiting for CMcondition %d\n", condition);
    }
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel locked cl\n");
    }
    cond = CMCondition_find(cl, condition);

    if (cond == NULL) return -1;
    if (cond->signaled) {
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMcondition %d already signalled\n", condition);
	}
	return 1;
    }
    if (cond->failed) {
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMcondition %d already failed\n", condition);
	}
	return 0;
    }
    cond->waiting++;
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel In condition wait, server thread = %p\n", 
	       (void*)(intptr_t)cl->server_thread);
    }
    if (!cl->has_thread) {
	if ((cl->server_thread ==  (thr_thread_id) 0) || (cl->server_thread == thr_thread_self())) {
	    cl->cond_polling = 1;
	    while (!(cond->signaled || cond->failed)) {
		if (cm_control_debug_flag) {
		    fprintf(cm->CMTrace_file, "CMLowLevel  Polling for CMcondition %d\n", condition);
		}
		CMcontrol_list_wait(cl);
	    }
	    cl->cond_polling = 0;
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel  after Polling for CMcondition %d\n", condition);
	    }
	    /* the poll and handle will set cl->server_thread, restore it */
	    cl->server_thread =  (thr_thread_id) (intptr_t)NULL;
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel  In condition wait, reset server thread = %lx\n", 
		       (long)cl->server_thread);
	    }
	} else {
	    /* some other thread is servicing the network here 
	       hopefully they'll keep doing it */
	    /* some other thread is the server thread */
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel Waiting for CMcondition %d\n", 
		       condition);
	    }
	    assert(CManager_locked(cm));
	    cm->locked--;
	    thr_condition_wait(cond->cond_condition, cm->exchange_lock);
	    cm->locked++;
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel After wait for CMcondition %d\n", 
		       condition);
	    }
	}
    } else if (thr_thread_self() == cl->server_thread) {
	/* we're the server thread */
	cl->cond_polling = 1;
	while (!(cond->signaled || cond->failed)) {
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel polling for CMcondition %d\n", condition);
	    }
	    CMcontrol_list_wait(cl);
	    if (cl->closed) cond->failed = 1;
	}
	cl->cond_polling = 0;
    } else {
	/* some other thread is the server thread */
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMLowLevel Waiting for CMcondition %d\n", 
		   condition);
	}
	assert(CManager_locked(cm));
	cm->locked--;
	thr_condition_wait(cond->cond_condition, cm->exchange_lock);
	cm->locked++;
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMLowLevel After wait for CMcondition %d\n", 
		   condition);
	}
    }
    result = cond->signaled;
    CMCondition_destroy(cl, condition);
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel Return from wait CMcondition %d\n", condition);
    }
    return result;
}